

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verbose.c
# Opt level: O0

void print_conflicts(int state)

{
  action *local_20;
  action *p;
  int number;
  int act;
  int symbol;
  int state_local;
  
  p._0_4_ = 0xffffffff;
  p._4_4_ = -1;
  number = -1;
  for (local_20 = parser[state]; local_20 != (action *)0x0; local_20 = local_20->next) {
    if (local_20->suppressed != '\x02') {
      if (local_20->symbol == number) {
        if (local_20->suppressed == '\x01') {
          if ((state == final_state) && (number == 0)) {
            fprintf((FILE *)verbose_file,"%d: shift/reduce conflict (accept, reduce %d) on $end\n",
                    (ulong)(uint)state,(ulong)(local_20->number - 2));
          }
          else if (p._4_4_ == 1) {
            fprintf((FILE *)verbose_file,"%d: shift/reduce conflict (shift %d, reduce %d) on %s\n",
                    (ulong)(uint)state,(ulong)(uint)p,(ulong)(local_20->number - 2),
                    symbol_name[number]);
          }
          else {
            fprintf((FILE *)verbose_file,"%d: reduce/reduce conflict (reduce %d, reduce %d) on %s\n"
                    ,(ulong)(uint)state,(ulong)((uint)p - 2),(ulong)(local_20->number - 2),
                    symbol_name[number]);
          }
        }
      }
      else {
        number = local_20->symbol;
        p._0_4_ = local_20->number;
        if (local_20->action_code == '\x01') {
          p._4_4_ = 1;
        }
        else {
          p._4_4_ = 2;
        }
      }
    }
  }
  return;
}

Assistant:

void print_conflicts(int state)
{
    register int symbol, act, number;
    register action *p;

    symbol = act = number = -1;
    for (p = parser[state]; p; p = p->next)
    {
	if (p->suppressed == 2)
	    continue;

	if (p->symbol != symbol)
	{
	    symbol = p->symbol;
	    number = p->number;
	    if (p->action_code == SHIFT)
		act = SHIFT;
	    else
		act = REDUCE;
	}
	else if (p->suppressed == 1)
	{
	    if (state == final_state && symbol == 0)
	    {
		fprintf(verbose_file, "%d: shift/reduce conflict "
			"(accept, reduce %d) on $end\n", state, p->number - 2);
	    }
	    else
	    {
		if (act == SHIFT)
		{
		    fprintf(verbose_file, "%d: shift/reduce conflict "
			    "(shift %d, reduce %d) on %s\n", state, number,
			    p->number - 2, symbol_name[symbol]);
		}
		else
		{
		    fprintf(verbose_file, "%d: reduce/reduce conflict "
			    "(reduce %d, reduce %d) on %s\n", state,
			    number - 2, p->number - 2, symbol_name[symbol]);
		}
	    }
	}
    }
}